

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateMachinePattern.cpp
# Opt level: O0

void __thiscall State1::executeStateTask(State1 *this)

{
  int iVar1;
  element_type *peVar2;
  element_type *this_00;
  reference pvVar3;
  size_t local_78;
  size_t nRsandNum;
  string local_68;
  allocator<char> local_31;
  value_type local_30;
  State1 *local_10;
  State1 *this_local;
  
  local_10 = this;
  peVar2 = std::__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_State).spData);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"State 1 was here",&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&peVar2->vGuestBook,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this_00 = std::__shared_ptr_access<Status,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Status,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &(this->super_State).spStatus);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"STM: Executing state 1",(allocator<char> *)((long)&nRsandNum + 7))
  ;
  Status::setStatusMessage(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&nRsandNum + 7));
  iVar1 = rand();
  while( true ) {
    local_78 = (size_t)(iVar1 % 4 + 1);
    peVar2 = std::__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &(this->super_State).spData);
    if (peVar2->nPreviousRandomNumber != local_78) break;
    iVar1 = rand();
  }
  peVar2 = std::__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_State).spData);
  peVar2->nPreviousRandomNumber = local_78;
  pvVar3 = std::vector<std::shared_ptr<State>,_std::allocator<std::shared_ptr<State>_>_>::operator[]
                     (&(this->super_State).spPossibleNextStates,local_78 - 1);
  std::shared_ptr<State>::operator=(&(this->super_State).spNextState,pvVar3);
  return;
}

Assistant:

void State1::executeStateTask()
{
    spData->vGuestBook.push_back( "State 1 was here" );
    spStatus->setStatusMessage("STM: Executing state 1");
    
    size_t nRsandNum = ( rand() % 4 ) + 1;
    
    while(spData->nPreviousRandomNumber == nRsandNum )
    {
        nRsandNum = ( rand() % 4 ) + 1;
    }
     
    spData->nPreviousRandomNumber = nRsandNum;

    spNextState = spPossibleNextStates[nRsandNum-1];
}